

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_as_json_x1000(void)

{
  char cVar1;
  undefined8 uVar2;
  time_t tVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  char *pcVar8;
  bool bVar9;
  undefined8 uStack_50;
  size_t len;
  bson_oid_t oid;
  bson_decimal128_t decimal128;
  
  decimal128.high = 0x3040000000000000;
  decimal128.low = 0xb;
  bson_oid_init_from_string(&oid,"123412341234abcdabcdabcd");
  uVar2 = bson_new();
  cVar1 = bson_append_utf8(uVar2,"utf8",0xffffffffffffffff,"bar",0xffffffff);
  if (cVar1 == '\0') {
    pcVar8 = "bson_append_utf8 (b, \"utf8\", -1, \"bar\", -1)";
    uStack_50 = 0x74;
  }
  else {
    cVar1 = bson_append_int32(uVar2,"int32",0xffffffffffffffff,0x4d2);
    if (cVar1 == '\0') {
      pcVar8 = "bson_append_int32 (b, \"int32\", -1, 1234)";
      uStack_50 = 0x75;
    }
    else {
      cVar1 = bson_append_int64(uVar2,"int64",0xffffffffffffffff,0x10e1);
      if (cVar1 == '\0') {
        pcVar8 = "bson_append_int64 (b, \"int64\", -1, 4321)";
        uStack_50 = 0x76;
      }
      else {
        cVar1 = bson_append_double(0x405ed9999999999a,uVar2,"double",0xffffffffffffffff);
        if (cVar1 == '\0') {
          pcVar8 = "bson_append_double (b, \"double\", -1, 123.4)";
          uStack_50 = 0x77;
        }
        else {
          cVar1 = bson_append_undefined(uVar2,"undefined",0xffffffffffffffff);
          if (cVar1 == '\0') {
            pcVar8 = "bson_append_undefined (b, \"undefined\", -1)";
            uStack_50 = 0x78;
          }
          else {
            cVar1 = bson_append_null(uVar2,"null",0xffffffffffffffff);
            if (cVar1 == '\0') {
              pcVar8 = "bson_append_null (b, \"null\", -1)";
              uStack_50 = 0x79;
            }
            else {
              cVar1 = bson_append_oid(uVar2,"oid",0xffffffffffffffff,&oid);
              if (cVar1 == '\0') {
                pcVar8 = "bson_append_oid (b, \"oid\", -1, &oid)";
                uStack_50 = 0x7a;
              }
              else {
                cVar1 = bson_append_bool(uVar2,"true",0xffffffffffffffff,1);
                if (cVar1 == '\0') {
                  pcVar8 = "bson_append_bool (b, \"true\", -1, true)";
                  uStack_50 = 0x7b;
                }
                else {
                  cVar1 = bson_append_bool(uVar2,"false",0xffffffffffffffff,0);
                  if (cVar1 == '\0') {
                    pcVar8 = "bson_append_bool (b, \"false\", -1, false)";
                    uStack_50 = 0x7c;
                  }
                  else {
                    tVar3 = time((time_t *)0x0);
                    cVar1 = bson_append_time_t(uVar2,"date",0xffffffffffffffff,tVar3);
                    if (cVar1 == '\0') {
                      pcVar8 = "bson_append_time_t (b, \"date\", -1, time (NULL))";
                      uStack_50 = 0x7d;
                    }
                    else {
                      uVar4 = time((time_t *)0x0);
                      cVar1 = bson_append_timestamp
                                        (uVar2,"timestamp",0xffffffffffffffff,uVar4 & 0xffffffff,
                                         0x4d2);
                      if (cVar1 == '\0') {
                        pcVar8 = 
                        "bson_append_timestamp (b, \"timestamp\", -1, (uint32_t) time (NULL), 1234)"
                        ;
                        uStack_50 = 0x7f;
                      }
                      else {
                        cVar1 = bson_append_regex(uVar2,"regex",0xffffffffffffffff,"^abcd","xi");
                        if (cVar1 == '\0') {
                          pcVar8 = "bson_append_regex (b, \"regex\", -1, \"^abcd\", \"xi\")";
                          uStack_50 = 0x80;
                        }
                        else {
                          cVar1 = bson_append_dbpointer
                                            (uVar2,"dbpointer",0xffffffffffffffff,"mycollection",
                                             &oid);
                          if (cVar1 == '\0') {
                            pcVar8 = 
                            "bson_append_dbpointer (b, \"dbpointer\", -1, \"mycollection\", &oid)";
                            uStack_50 = 0x82;
                          }
                          else {
                            cVar1 = bson_append_minkey(uVar2,"minkey",0xffffffffffffffff);
                            if (cVar1 == '\0') {
                              pcVar8 = "bson_append_minkey (b, \"minkey\", -1)";
                              uStack_50 = 0x83;
                            }
                            else {
                              cVar1 = bson_append_maxkey(uVar2,"maxkey",0xffffffffffffffff);
                              if (cVar1 == '\0') {
                                pcVar8 = "bson_append_maxkey (b, \"maxkey\", -1)";
                                uStack_50 = 0x84;
                              }
                              else {
                                cVar1 = bson_append_symbol(uVar2,"symbol",0xffffffffffffffff,
                                                           "var a = {};",0xffffffff);
                                if (cVar1 == '\0') {
                                  pcVar8 = 
                                  "bson_append_symbol (b, \"symbol\", -1, \"var a = {};\", -1)";
                                  uStack_50 = 0x85;
                                }
                                else {
                                  cVar1 = bson_append_decimal128
                                                    (uVar2,"decimal128",0xffffffffffffffff,
                                                     &decimal128);
                                  if (cVar1 == '\0') {
                                    pcVar8 = 
                                    "bson_append_decimal128 (b, \"decimal128\", -1, &decimal128)";
                                    uStack_50 = 0x86;
                                  }
                                  else {
                                    uVar5 = bson_new();
                                    cVar1 = bson_append_int32(uVar5,"0",0xffffffffffffffff,0x3c);
                                    if (cVar1 == '\0') {
                                      pcVar8 = "bson_append_int32 (b2, \"0\", -1, 60)";
                                      uStack_50 = 0x89;
                                    }
                                    else {
                                      cVar1 = bson_append_document
                                                        (uVar2,"document",0xffffffffffffffff,uVar5);
                                      if (cVar1 == '\0') {
                                        pcVar8 = "bson_append_document (b, \"document\", -1, b2)";
                                        uStack_50 = 0x8a;
                                      }
                                      else {
                                        cVar1 = bson_append_array(uVar2,"array",0xffffffffffffffff,
                                                                  uVar5);
                                        if (cVar1 == '\0') {
                                          pcVar8 = "bson_append_array (b, \"array\", -1, b2)";
                                          uStack_50 = 0x8b;
                                        }
                                        else {
                                          len._4_1_ = 4;
                                          len._0_4_ = 0x3020100;
                                          cVar1 = bson_append_binary(uVar2,"binary",
                                                                     0xffffffffffffffff,0,&len,5);
                                          if (cVar1 != '\0') {
                                            iVar7 = 1000;
                                            while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
                                              uVar6 = bson_as_json(uVar2,&len);
                                              bson_free(uVar6);
                                            }
                                            bson_destroy(uVar2);
                                            bson_destroy(uVar5);
                                            return;
                                          }
                                          pcVar8 = 
                                          "bson_append_binary ( b, \"binary\", -1, BSON_SUBTYPE_BINARY, binary, sizeof binary)"
                                          ;
                                          uStack_50 = 0x90;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uStack_50,"test_bson_as_json_x1000",pcVar8);
  abort();
}

Assistant:

static void
test_bson_as_json_x1000 (void)
{
   bson_oid_t oid;
   bson_decimal128_t decimal128;
   bson_t *b;
   bson_t *b2;
   char *str;
   size_t len;
   int i;

   decimal128.high = 0x3040000000000000ULL;
   decimal128.low = 0x000000000000000B;
   bson_oid_init_from_string (&oid, "123412341234abcdabcdabcd");

   b = bson_new ();
   BSON_ASSERT (bson_append_utf8 (b, "utf8", -1, "bar", -1));
   BSON_ASSERT (bson_append_int32 (b, "int32", -1, 1234));
   BSON_ASSERT (bson_append_int64 (b, "int64", -1, 4321));
   BSON_ASSERT (bson_append_double (b, "double", -1, 123.4));
   BSON_ASSERT (bson_append_undefined (b, "undefined", -1));
   BSON_ASSERT (bson_append_null (b, "null", -1));
   BSON_ASSERT (bson_append_oid (b, "oid", -1, &oid));
   BSON_ASSERT (bson_append_bool (b, "true", -1, true));
   BSON_ASSERT (bson_append_bool (b, "false", -1, false));
   BSON_ASSERT (bson_append_time_t (b, "date", -1, time (NULL)));
   BSON_ASSERT (
      bson_append_timestamp (b, "timestamp", -1, (uint32_t) time (NULL), 1234));
   BSON_ASSERT (bson_append_regex (b, "regex", -1, "^abcd", "xi"));
   BSON_ASSERT (
      bson_append_dbpointer (b, "dbpointer", -1, "mycollection", &oid));
   BSON_ASSERT (bson_append_minkey (b, "minkey", -1));
   BSON_ASSERT (bson_append_maxkey (b, "maxkey", -1));
   BSON_ASSERT (bson_append_symbol (b, "symbol", -1, "var a = {};", -1));
   BSON_ASSERT (bson_append_decimal128 (b, "decimal128", -1, &decimal128));

   b2 = bson_new ();
   BSON_ASSERT (bson_append_int32 (b2, "0", -1, 60));
   BSON_ASSERT (bson_append_document (b, "document", -1, b2));
   BSON_ASSERT (bson_append_array (b, "array", -1, b2));

   {
      const uint8_t binary[] = {0, 1, 2, 3, 4};
      BSON_ASSERT (bson_append_binary (
         b, "binary", -1, BSON_SUBTYPE_BINARY, binary, sizeof binary));
   }

   for (i = 0; i < 1000; i++) {
      str = bson_as_json (b, &len);
      bson_free (str);
   }

   bson_destroy (b);
   bson_destroy (b2);
}